

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::InitDataBlock(TwoLevelIterator *this)

{
  int iVar1;
  undefined4 extraout_var;
  Iterator *data_iter;
  Slice handle;
  Slice local_38;
  Slice local_28;
  
  if ((this->index_iter_).valid_ == false) {
    SetDataIterator(this,(Iterator *)0x0);
    return;
  }
  iVar1 = (*((this->index_iter_).iter_)->_vptr_Iterator[9])();
  local_38.data_ = (char *)CONCAT44(extraout_var,iVar1);
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    local_28.data_ = (this->data_block_handle_)._M_dataplus._M_p;
    local_28.size_ = (this->data_block_handle_)._M_string_length;
    iVar1 = Slice::compare(&local_38,&local_28);
    if (iVar1 == 0) {
      return;
    }
  }
  data_iter = (*this->block_function_)(this->arg_,&this->options_,&local_38);
  std::__cxx11::string::assign((char *)&this->data_block_handle_,(ulong)local_38.data_);
  SetDataIterator(this,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::InitDataBlock() {
  if (!index_iter_.Valid()) {
    SetDataIterator(nullptr);
  } else {
    Slice handle = index_iter_.value();
    if (data_iter_.iter() != nullptr &&
        handle.compare(data_block_handle_) == 0) {
      // data_iter_ is already constructed with this iterator, so
      // no need to change anything
    } else {
      Iterator* iter = (*block_function_)(arg_, options_, handle);
      data_block_handle_.assign(handle.data(), handle.size());
      SetDataIterator(iter);
    }
  }
}